

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcCube.c
# Opt level: O3

void Mvc_CubeBitRemoveDcs(Mvc_Cube_t *pCube)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar2 = (ulong)(*(uint *)&pCube->field_0x8 & 0xffffff);
  do {
    uVar1 = pCube->pData[uVar2];
    pCube->pData[uVar2] = ((uVar1 >> 1 ^ uVar1) & 0x55555555) * 3 & uVar1;
    bVar3 = uVar2 != 0;
    uVar2 = uVar2 - 1;
  } while (bVar3);
  return;
}

Assistant:

void Mvc_CubeBitRemoveDcs( Mvc_Cube_t * pCube )
{
    unsigned Mask;
    int i;
    for ( i = Mvc_CubeReadLast(pCube); i >= 0; i-- )
    {
        // detect those variables that are different (not DCs)
        Mask = (pCube->pData[i] ^ (pCube->pData[i] >> 1)) & BITS_DISJOINT; 
        // create the mask of all that are different
        Mask |= (Mask << 1);
        // remove other bits from the set
        pCube->pData[i] &= Mask;
    }
}